

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CompilationUnitSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CompilationUnitSyntax,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::MemberSyntax> *args,Token *args_1)

{
  Token endOfFile;
  CompilationUnitSyntax *pCVar1;
  SyntaxList<slang::syntax::MemberSyntax> *in_RDX;
  CompilationUnitSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pCVar1 = (CompilationUnitSyntax *)
           allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  endOfFile.info = unaff_retaddr;
  endOfFile.kind = (short)in_RDI;
  endOfFile._2_1_ = (char)((ulong)in_RDI >> 0x10);
  endOfFile.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  endOfFile.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::CompilationUnitSyntax::CompilationUnitSyntax(in_RSI,in_RDX,endOfFile);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }